

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O3

Node __thiscall trieste::Parse::parse_source(Parse *this,string *name,Token *token,Source *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  long lVar3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  runtime_error *prVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Source *in_R8;
  _Base_ptr p_Var8;
  Node NVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mode;
  Make make;
  key_type local_128;
  string *local_108;
  Parse *local_100;
  _Base_ptr local_f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
  *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Make local_c8;
  
  if ((in_R8->super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    *(undefined8 *)this = 0;
    this->wf_ = (Wellformed *)0x0;
  }
  else {
    detail::Make::Make(&local_c8,(string *)token,(Token *)source,in_R8);
    paVar1 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"start","");
    local_f0 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                *)((long)&name[7].field_2 + 8);
    cVar6 = CLI::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
            ::find(local_f0,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_f8 = (_Base_ptr)(name + 8);
    local_100 = this;
    if (cVar6._M_node == local_f8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"unknown mode: start");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_108 = name;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8.mode_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (cVar6._M_node + 1));
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,local_c8.mode_._M_dataplus._M_p,
               local_c8.mode_._M_dataplus._M_p + local_c8.mode_._M_string_length);
    if (local_c8.re_iterator.sp.size_ != 0) {
      do {
        p_Var2 = cVar6._M_node[2]._M_parent;
        for (p_Var8 = *(_Base_ptr *)(cVar6._M_node + 2); p_Var8 != p_Var2;
            p_Var8 = (_Base_ptr)&p_Var8->_M_left) {
          bVar4 = REIterator::consume(&local_c8.re_iterator,*(RE2 **)p_Var8,&local_c8.re_match);
          if (bVar4) {
            lVar3 = *(long *)p_Var8;
            if (*(long *)(lVar3 + 0xa8) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(lVar3 + 0xb0))(lVar3 + 0x98,&local_c8);
            if ((local_c8.mode_._M_string_length != local_128._M_string_length) ||
               ((local_c8.mode_._M_string_length != 0 &&
                (iVar5 = bcmp(local_c8.mode_._M_dataplus._M_p,local_128._M_dataplus._M_p,
                              local_c8.mode_._M_string_length), iVar5 != 0)))) {
              cVar6 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                      ::find(local_f0,&local_c8.mode_);
              if (cVar6._M_node == local_f8) {
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(&local_e8,"unknown mode: ",&local_c8.mode_);
                std::runtime_error::runtime_error(prVar7,(string *)&local_e8);
                __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_128,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (cVar6._M_node + 1));
            }
            goto LAB_001880fc;
          }
        }
        local_e8._M_dataplus._M_p = Invalid;
        detail::Make::extend(&local_c8,(Token *)&local_e8,0);
        local_c8.re_iterator.sp.data_ = local_c8.re_iterator.sp.data_ + 1;
        local_c8.re_iterator.sp.size_ = local_c8.re_iterator.sp.size_ - 1;
LAB_001880fc:
      } while (local_c8.re_iterator.sp.size_ != 0);
    }
    this = local_100;
    if (local_108[7]._M_string_length != 0) {
      (*(code *)local_108[7].field_2._M_allocated_capacity)
                ((undefined1 *)((long)&local_108[6].field_2 + 8),&local_c8);
    }
    detail::Make::done((Make *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.re_iterator.source.
        super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.re_iterator.source.
                 super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    CLI::std::vector<trieste::Location,_std::allocator<trieste::Location>_>::~vector
              (&local_c8.re_match.locations);
    token = (Token *)extraout_RDX;
    if (local_c8.re_match.match.
        super__Vector_base<re2::StringPiece,_std::allocator<re2::StringPiece>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.re_match.match.
                      super__Vector_base<re2::StringPiece,_std::allocator<re2::StringPiece>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.re_match.match.
                            super__Vector_base<re2::StringPiece,_std::allocator<re2::StringPiece>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.re_match.match.
                            super__Vector_base<re2::StringPiece,_std::allocator<re2::StringPiece>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      token = (Token *)extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.mode_._M_dataplus._M_p != &local_c8.mode_.field_2) {
      operator_delete(local_c8.mode_._M_dataplus._M_p,
                      local_c8.mode_.field_2._M_allocated_capacity + 1);
      token = (Token *)extraout_RDX_01;
    }
    if (local_c8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      token = (Token *)extraout_RDX_02;
    }
    if (local_c8.top.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.top.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      token = (Token *)extraout_RDX_03;
    }
  }
  NVar9.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)token;
  NVar9.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar9.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node parse_source(
      const std::string name, const Token& token, const Source& source) const
    {
      if (!source)
        return {};

      auto make = detail::Make(name, token, source);

      // Find the start rules.
      auto find = rules.find("start");
      if (find == rules.end())
        throw std::runtime_error("unknown mode: start");

      auto mode = make.mode_ = find->first;

      while (!make.re_iterator.empty())
      {
        bool matched = false;

        for (auto& rule : find->second)
        {
          matched = make.re_iterator.consume(rule->regex, make.re_match);

          if (matched)
          {
            rule->effect(make);

            if (make.mode_ != mode)
            {
              find = rules.find(make.mode_);
              if (find == rules.end())
                throw std::runtime_error("unknown mode: " + make.mode_);

              mode = find->first;
            }
            break;
          }
        }

        if (!matched)
        {
          make.invalid();
          make.re_iterator.skip();
        }
      }

      if (done_)
        done_(make);

      return make.done();
    }